

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialassetid.cpp
# Opt level: O2

void __thiscall
ConfidentialAssetId_Constractor_bytedata_err_Test::TestBody
          (ConfidentialAssetId_Constractor_bytedata_err_Test *this)

{
  bool bVar1;
  allocator local_71;
  string local_70;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  ConfidentialAssetId assetid;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_70,"001122",&local_71);
    cfd::core::ByteData::ByteData((ByteData *)&local_50,&local_70);
    cfd::core::ConfidentialAssetId::ConfidentialAssetId(&assetid,(ByteData *)&local_50);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&assetid);
  }
  testing::Message::Message((Message *)&assetid);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_70,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialassetid.cpp"
             ,0x6f,
             "Expected: ConfidentialAssetId assetid(ByteData(\"001122\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&assetid);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&assetid);
  return;
}

Assistant:

TEST(ConfidentialAssetId, Constractor_bytedata_err) {
  // error
  EXPECT_THROW(ConfidentialAssetId assetid(ByteData("001122")), CfdException);
}